

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenStringSliceIterSetNum(BinaryenExpressionRef expr,BinaryenExpressionRef numExpr)

{
  if (expr->_id != StringSliceIterId) {
    __assert_fail("expression->is<StringSliceIter>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1332,
                  "void BinaryenStringSliceIterSetNum(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (numExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)numExpr;
    return;
  }
  __assert_fail("numExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1333,
                "void BinaryenStringSliceIterSetNum(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringSliceIterSetNum(BinaryenExpressionRef expr,
                                   BinaryenExpressionRef numExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceIter>());
  assert(numExpr);
  static_cast<StringSliceIter*>(expression)->num = (Expression*)numExpr;
}